

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltalloc.cc
# Opt level: O2

void ltsqueeze(size_t padsz)

{
  short sVar1;
  uintptr_t uVar2;
  FreeBlock *pFVar3;
  size_t sVar4;
  uint uVar5;
  void *pvVar6;
  uint uVar7;
  FreeBlock *pFVar8;
  anon_union_8_2_974a5362_for_CentralCache_3 *paVar9;
  uint *puVar10;
  ulong uVar11;
  Chunk **c;
  uint *puVar12;
  anon_union_8_2_974a5362_for_CentralCache_3 *paVar13;
  FreeBlock *pFVar14;
  uint uVar15;
  FreeBlock *pFVar16;
  CentralCache *lock;
  ulong uVar17;
  uint *__addr;
  char *__s;
  bool bVar18;
  FreeBlock *additionalBlocksList;
  FreeBlock *freeList;
  FreeBlock *firstBatch;
  ulong local_8068;
  size_t local_8060;
  ulong local_8058;
  FreeBlock *local_8050;
  FreeBlock *additionalBatchesList;
  size_t local_8040;
  char buffer [32768];
  
  uVar11 = 0x13;
  local_8040 = padsz;
  do {
    if (uVar11 == 0x104) {
      return;
    }
    local_8068 = uVar11;
    if (0x10000 < centralCache[uVar11].maxChunkAddr - centralCache[uVar11].minChunkAddr) {
      lock = centralCache + uVar11;
      spinlock_acquire(&lock->lock);
      uVar2 = centralCache[uVar11].minChunkAddr;
      uVar17 = centralCache[uVar11].maxChunkAddr - uVar2;
      if (uVar17 < 0x10001) {
        lock->lock = 0;
      }
      else {
        uVar17 = uVar17 >> 0x10;
        local_8060 = uVar17 * 2 + 2;
        uVar17 = uVar17 * 2;
        uVar15 = centralCache[uVar11].freeListSize;
        firstBatch = centralCache[uVar11].field_3.firstBatch;
        pFVar14 = centralCache[uVar11].freeList;
        centralCache[uVar11].freeListSize = 0;
        centralCache[uVar11].field_3.firstBatch = (FreeBlock *)0x0;
        centralCache[uVar11].freeList = (FreeBlock *)0x0;
        lock->lock = 0;
        freeList = pFVar14;
        local_8050 = firstBatch;
        if (uVar17 < 0x7fff) {
          __s = buffer;
          memset(__s,0,local_8060);
        }
        else {
          pvVar6 = mmap((void *)0x0,local_8060,3,0x22,-1,0);
          __s = (char *)((long)pvVar6 + 1U & 0xfffffffffffffffe);
        }
        uVar7 = (int)local_8068 - 3;
        local_8058 = uVar17;
        if (__s == (char *)0x0) {
          paVar13 = (anon_union_8_2_974a5362_for_CentralCache_3 *)&firstBatch;
          do {
            paVar9 = paVar13;
            paVar13 = (anon_union_8_2_974a5362_for_CentralCache_3 *)&paVar9->firstBatch->nextBatch;
          } while (paVar9->firstBatch != (FreeBlock *)0x0);
          pFVar14 = (FreeBlock *)&freeList;
          do {
            pFVar8 = pFVar14;
            pFVar14 = pFVar8->next;
          } while (pFVar8->next != (FreeBlock *)0x0);
        }
        else {
          __addr = (uint *)0x0;
          paVar9 = (anon_union_8_2_974a5362_for_CentralCache_3 *)&firstBatch;
          for (pFVar8 = local_8050;
              uVar5 = (uint)(0xffc0 / (ulong)((uVar7 & 3 | 4) << ((char)(uVar7 >> 2) - 2U & 0x1f))),
              pFVar8 != (FreeBlock *)0x0; pFVar8 = pFVar8->nextBatch) {
            for (; pFVar8 != (FreeBlock *)0x0; pFVar8 = pFVar8->next) {
              uVar17 = (long)pFVar8 - uVar2 >> 0x10;
              sVar1 = *(short *)(__s + uVar17 * 2);
              *(ushort *)(__s + uVar17 * 2) = sVar1 + 1U;
              puVar12 = __addr;
              if (uVar5 == (ushort)(sVar1 + 1U)) {
                puVar12 = (uint *)((ulong)pFVar8 & 0xffffffffffff0000);
                if (local_8068 != *puVar12) {
                  __assert_fail("chunk->sizeClass == sizeClass",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/ltalloc/ltalloc.cc"
                                ,0x489,"void ltsqueeze(size_t)");
                }
                *(uint **)puVar12 = __addr;
              }
              __addr = puVar12;
            }
            pFVar8 = paVar9->firstBatch;
            paVar9 = (anon_union_8_2_974a5362_for_CentralCache_3 *)&pFVar8->nextBatch;
          }
          pFVar8 = (FreeBlock *)&freeList;
          while (pFVar14 != (FreeBlock *)0x0) {
            uVar17 = (long)pFVar14 - uVar2 >> 0x10;
            sVar1 = *(short *)(__s + uVar17 * 2);
            *(ushort *)(__s + uVar17 * 2) = sVar1 + 1U;
            puVar12 = __addr;
            if (uVar5 == (ushort)(sVar1 + 1U)) {
              puVar12 = (uint *)((ulong)pFVar14 & 0xffffffffffff0000);
              if (local_8068 != *puVar12) {
                __assert_fail("chunk->sizeClass == sizeClass",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/ltalloc/ltalloc.cc"
                              ,0x48b,"void ltsqueeze(size_t)");
              }
              *(uint **)puVar12 = __addr;
              pFVar14 = pFVar8->next;
            }
            pFVar8 = pFVar14;
            __addr = puVar12;
            pFVar14 = pFVar8->next;
          }
          if (__addr != (uint *)0x0) {
            additionalBatchesList = (FreeBlock *)0x0;
            additionalBlocksList = (FreeBlock *)0x0;
            uVar7 = 0xffffU >> ((byte)(local_8068 >> 2) & 0x1f) & 0xff;
            uVar15 = 0;
            paVar13 = (anon_union_8_2_974a5362_for_CentralCache_3 *)&additionalBatchesList;
            paVar9 = (anon_union_8_2_974a5362_for_CentralCache_3 *)&firstBatch;
            pFVar14 = local_8050;
            pFVar8 = (FreeBlock *)&additionalBlocksList;
LAB_001339e9:
            for (; pFVar16 = pFVar14, pFVar14 != (FreeBlock *)0x0; pFVar14 = pFVar14->nextBatch) {
              for (; pFVar16 != (FreeBlock *)0x0; pFVar16 = pFVar16->next) {
                if (uVar5 == *(ushort *)(__s + ((long)pFVar16 - uVar2 >> 0x10) * 2)) {
                  pFVar16 = pFVar14->nextBatch;
                  goto LAB_00133a24;
                }
              }
              paVar9 = (anon_union_8_2_974a5362_for_CentralCache_3 *)&pFVar14->nextBatch;
            }
            while (pFVar14 = freeList, pFVar14 != (FreeBlock *)0x0) {
              if (uVar5 == *(ushort *)(__s + ((long)pFVar14 - uVar2 >> 0x10) * 2)) {
                freeList = pFVar14->next;
              }
              else {
                pFVar8->next = pFVar14;
                pFVar16 = additionalBlocksList;
                freeList = pFVar14->next;
                pFVar14->next = (FreeBlock *)0x0;
                bVar18 = uVar15 == uVar7;
                uVar15 = uVar15 + 1;
                pFVar8 = pFVar14;
                if (bVar18) {
                  paVar13->firstBatch = additionalBlocksList;
                  additionalBlocksList->nextBatch = (FreeBlock *)0x0;
                  additionalBlocksList = (FreeBlock *)0x0;
                  paVar13 = (anon_union_8_2_974a5362_for_CentralCache_3 *)&pFVar16->nextBatch;
                  uVar15 = 0;
                  pFVar8 = (FreeBlock *)&additionalBlocksList;
                }
              }
            }
            paVar13->firstBatch = (FreeBlock *)*(FreeBlock **)paVar9;
            paVar9->firstBatch = additionalBatchesList;
            freeList = additionalBlocksList;
            spinlock_acquire(&lock->lock);
            *paVar9 = centralCache[uVar11].field_3;
            centralCache[uVar11].field_3.firstBatch = firstBatch;
            pFVar8->next = centralCache[uVar11].freeList;
            centralCache[uVar11].freeList = freeList;
            centralCache[uVar11].freeListSize = centralCache[uVar11].freeListSize + uVar15;
            lock->lock = 0;
            if (0x7ffe < local_8058) {
              munmap(__s,local_8060);
            }
            sVar4 = local_8040;
            if (local_8040 != 0) {
              spinlock_acquire(&pad.lock);
              puVar12 = __addr;
              if (pad.size < sVar4) {
                do {
                  puVar10 = puVar12;
                  puVar12 = *(uint **)puVar10;
                  pad.size = pad.size + 0x10000;
                  if (sVar4 <= pad.size) break;
                } while (puVar12 != (uint *)0x0);
                *(void **)puVar10 = pad.freeChunk;
                pad.freeChunk = __addr;
              }
              pad.lock = 0;
              __addr = puVar12;
            }
            while (__addr != (uint *)0x0) {
              puVar12 = *(uint **)__addr;
              munmap(__addr,0x10000);
              __addr = puVar12;
            }
            goto LAB_00133c9a;
          }
        }
        spinlock_acquire(&lock->lock);
        *paVar9 = centralCache[uVar11].field_3;
        centralCache[uVar11].field_3.firstBatch = firstBatch;
        pFVar8->next = centralCache[uVar11].freeList;
        centralCache[uVar11].freeList = freeList;
        centralCache[uVar11].freeListSize = centralCache[uVar11].freeListSize + uVar15;
        lock->lock = 0;
        if (0x7ffe < local_8058) {
          munmap(__s,local_8060);
        }
      }
    }
LAB_00133c9a:
    uVar11 = local_8068 + 1;
  } while( true );
LAB_00133a24:
  if (pFVar14 != (FreeBlock *)0x0) {
    if (uVar5 == *(ushort *)(__s + ((long)pFVar14 - uVar2 >> 0x10) * 2)) {
      pFVar14 = pFVar14->next;
    }
    else {
      pFVar8->next = pFVar14;
      pFVar3 = additionalBlocksList;
      do {
        pFVar8 = pFVar14;
        uVar15 = uVar15 + 1;
        pFVar14 = pFVar8->next;
        if (uVar15 - uVar7 == 1) {
          paVar13->firstBatch = additionalBlocksList;
          additionalBlocksList->nextBatch = (FreeBlock *)0x0;
          pFVar8->next = (FreeBlock *)0x0;
          additionalBlocksList = (FreeBlock *)0x0;
          paVar13 = (anon_union_8_2_974a5362_for_CentralCache_3 *)&pFVar3->nextBatch;
          uVar15 = 0;
          pFVar8 = (FreeBlock *)&additionalBlocksList;
          break;
        }
        if (pFVar14 == (FreeBlock *)0x0) {
          pFVar14 = (FreeBlock *)0x0;
          break;
        }
      } while (uVar5 != *(ushort *)(__s + ((long)pFVar14 - uVar2 >> 0x10) * 2));
    }
    goto LAB_00133a24;
  }
  pFVar8->next = (FreeBlock *)0x0;
  paVar9->firstBatch = pFVar16;
  pFVar14 = pFVar16;
  goto LAB_001339e9;
}

Assistant:

void ltsqueeze(size_t padsz)
{
	unsigned int sizeClass = get_size_class(2 * sizeof(void*));//skip small chunks because corresponding batches can not be efficiently detached from the central cache (if that becomes relevant, may be it worths to reimplement batches for small chunks from array to linked lists)
	for (; sizeClass < NUMBER_OF_SIZE_CLASSES; sizeClass++)
	{
		CentralCache* cc = &centralCache[sizeClass];
		if (cc->maxChunkAddr - cc->minChunkAddr <= CHUNK_SIZE)//preliminary check without lock (assume that writing to minChunkAddr/maxChunkAddr is atomic)
			continue;

		SPINLOCK_ACQUIRE(&cc->lock);
		if (cc->maxChunkAddr - cc->minChunkAddr <= CHUNK_SIZE) {//quick check for theoretical possibility that at least one chunk is totally free
			SPINLOCK_RELEASE(&cc->lock);
			continue;
		}
		{uintptr_t minChunkAddr = cc->minChunkAddr;
		size_t bufferSize = ((cc->maxChunkAddr - minChunkAddr) / CHUNK_SIZE + 1) * sizeof(short);
		//Quickly detach all batches of the current size class from the central cache
		unsigned int freeListSize = cc->freeListSize;
		FreeBlock* firstBatch = cc->firstBatch, * freeList = cc->freeList;
		cc->firstBatch = NULL;
		cc->freeList = NULL;
		cc->freeListSize = 0;
		SPINLOCK_RELEASE(&cc->lock);

		//1. Find out chunks with only free blocks via a simple counting the number of free blocks in each chunk
		{char buffer[32 * 1024];//enough for 1GB address space
		unsigned short* inChunkFreeBlocks = (unsigned short*)(bufferSize <= sizeof(buffer) ? memset(buffer, 0, bufferSize) : LTALLOC_VMALLOC(bufferSize));
		unsigned int numBlocksInChunk = (CHUNK_SIZE - (/*CHUNK_IS_SMALL ? sizeof(ChunkSm) : */sizeof(Chunk))) / class_to_size(sizeClass);
		FreeBlock** pbatch, * block, ** pblock;
		Chunk* firstFreeChunk = NULL;
		LTALLOC_ASSERT(numBlocksInChunk < (1U << (sizeof(short) * 8)));//in case if CHUNK_SIZE is too big that total count of blocks in it doesn't fit at short type (...may be use static_assert instead?)
		if (inChunkFreeBlocks)//consider VMALLOC can fail
		{
			for (pbatch = &firstBatch; *pbatch; pbatch = &(*pbatch)->nextBatch)
				for (block = *pbatch; block; block = block->next)
#define FREE_BLOCK(block) \
					if (++inChunkFreeBlocks[((uintptr_t)block - minChunkAddr) / CHUNK_SIZE] == numBlocksInChunk)/*chunk is totally free*/\
					{\
						Chunk *chunk = (Chunk*)((uintptr_t)block & ~(CHUNK_SIZE-1));\
						LTALLOC_ASSERT(chunk->sizeClass == sizeClass);/*just in case check before overwriting this info*/\
						*(Chunk**)chunk = firstFreeChunk;/*put nextFreeChunk pointer right at the beginning of Chunk as there are always must be a space for one pointer before first memory block*/\
						firstFreeChunk = chunk;\
					}
					FREE_BLOCK(block)
					for (pblock = &freeList; *pblock; pblock = &(*pblock)->next)
						FREE_BLOCK(*pblock)
#undef FREE_BLOCK
		}
		else {
			for (pbatch = &firstBatch; *pbatch; pbatch = &(*pbatch)->nextBatch);
			for (pblock = &freeList; *pblock; pblock = &(*pblock)->next);
		}

		if (firstFreeChunk)//is anything to release
		{
			//2. Unlink all matching blocks from the corresponding free lists
			FreeBlock* additionalBatchesList = NULL, * additionalBlocksList = NULL, ** abatch = &additionalBatchesList, ** ablock = &additionalBlocksList;
			unsigned int additionalBlocksListSize = 0, batchSize = batch_size(sizeClass) + 1;
			for (pbatch = &firstBatch; *pbatch;)
			{
				for (block = *pbatch; block; block = block->next)
					if (inChunkFreeBlocks[((uintptr_t)block - minChunkAddr) / CHUNK_SIZE] == numBlocksInChunk)//if at least one block belongs to a releasable chunk, then this batch should be handled specially
					{
						FreeBlock* nextBatch = (*pbatch)->nextBatch;
						for (block = *pbatch; block;)//re-add blocks of not-for-release chunks and organize them into another batches' list (to join it with the main later)
							if (inChunkFreeBlocks[((uintptr_t)block - minChunkAddr) / CHUNK_SIZE] != numBlocksInChunk)//skip matching-for-release blocks
							{
								*ablock = block;
								do//this loop needed only to minimize memory write operations, otherwise a simpler approach could be used (like in the next loop below)
								{
									ablock = &block->next;
									block = block->next;
									if (++additionalBlocksListSize == batchSize)
									{
										abatch = &(*abatch = additionalBlocksList)->nextBatch;
										*abatch = NULL;
										*ablock = NULL;
										ablock = &additionalBlocksList;
										additionalBlocksList = NULL;
										additionalBlocksListSize = 0;
										break;//to force *ablock = block; for starting a new batch
									}
								} while (block && inChunkFreeBlocks[((uintptr_t)block - minChunkAddr) / CHUNK_SIZE] != numBlocksInChunk);
							}
							else
								block = block->next;
						*ablock = NULL;
						*pbatch = nextBatch;//unlink batch
						goto continue_;
					}
				pbatch = &(*pbatch)->nextBatch;
			continue_:;
			}
			for (block = freeList; block;)
				if (inChunkFreeBlocks[((uintptr_t)block - minChunkAddr) / CHUNK_SIZE] != numBlocksInChunk)
				{
					//*pblock = (*pblock)->next, freeListSize--;//unlink block
					ablock = &(*ablock = block)->next;
					block = block->next;
					*ablock = NULL;
					if (++additionalBlocksListSize == batchSize)
					{
						abatch = &(*abatch = additionalBlocksList)->nextBatch;
						*abatch = NULL;
						ablock = &additionalBlocksList;
						additionalBlocksList = NULL;
						additionalBlocksListSize = 0;
					}
				}
				else
					block = block->next;
			//Add additional lists
			*abatch = *pbatch;
			*pbatch = additionalBatchesList;
			pblock = ablock;
			freeList = additionalBlocksList;
			freeListSize = additionalBlocksListSize;

			//Return back all left not-for-release blocks to the central cache as quickly as possible (as other threads may want to allocate a new memory)
#define GIVE_LISTS_BACK_TO_CC \
			SPINLOCK_ACQUIRE(&cc->lock);\
			*pbatch = cc->firstBatch;\
			cc->firstBatch = firstBatch;\
			*pblock = cc->freeList;\
			cc->freeList = freeList;\
			cc->freeListSize += freeListSize;\
			SPINLOCK_RELEASE(&cc->lock);\
			if (bufferSize > sizeof(buffer)) LTALLOC_VMFREE(inChunkFreeBlocks, bufferSize);//this better to do before 3. as kernel is likely optimized for release of just allocated range
			GIVE_LISTS_BACK_TO_CC

				if (padsz)
				{
					SPINLOCK_ACQUIRE(&pad.lock);
					if (pad.size < padsz)
					{
						Chunk* first = firstFreeChunk, ** c;
						do//put off free chunks up to a specified pad size
						{
							c = (Chunk**)firstFreeChunk;
							firstFreeChunk = *c;
							pad.size += CHUNK_SIZE;
						} while (pad.size < padsz && firstFreeChunk);
						*c = (Chunk*)pad.freeChunk;
						pad.freeChunk = first;
					}
					SPINLOCK_RELEASE(&pad.lock);
				}

			//3. Return memory to the system
			while (firstFreeChunk)
			{
				Chunk* nextFreeChunk = *(Chunk**)firstFreeChunk;
				LTALLOC_VMFREE(firstFreeChunk, CHUNK_SIZE);
				firstFreeChunk = nextFreeChunk;
			}
		}
		else//nothing to release - just return batches back to the central cache
		{
			GIVE_LISTS_BACK_TO_CC
#undef GIVE_LISTS_BACK_TO_CC
		}}}
	}
}